

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<ExpressionStatementAstNode>_> * __thiscall
Parser::parseExpressionStatement
          (optional<std::shared_ptr<ExpressionStatementAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 local_78 [16];
  shared_ptr<ExpressionAstNode> local_68 [2];
  undefined1 local_48 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expr;
  bool error;
  
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_48,this);
  expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"Expected a semicolon following expression statement",
             (allocator<char> *)
             &expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
              .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x16);
  expect((Parser *)local_78,(TokenType)this,(bool *)0x10,
         (string *)
         &expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::__cxx11::string::~string((string *)local_68);
  if ((expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ == '\0') &&
     (expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ != '\0')) {
    std::make_shared<ExpressionStatementAstNode,std::shared_ptr<ExpressionAstNode>&>(local_68);
    _Var1._M_pi = local_68[0].super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ExpressionStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_68[0].super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68[0].super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ExpressionStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    local_68[0].super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_engaged = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68[0].super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_engaged = false;
  }
  std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionStatementAstNode>>
Parser::parseExpressionStatement() noexcept {
  auto expr = this->parseExpression();
  bool error = false;
  this->expect(TokenType::SemiColon, error, "Expected a semicolon following expression statement");

  if (error || !expr) {
    return std::nullopt;
  }

  return std::make_shared<ExpressionStatementAstNode>(expr.value());
}